

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::utils::MakeVector
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *input
          )

{
  string *input_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  AppendToVector(input,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint32_t> MakeVector(const std::string& input) {
  std::vector<uint32_t> result;
  AppendToVector(input, &result);
  return result;
}